

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

tmbstr prvTidytmbstrndup(TidyAllocator *allocator,ctmbstr str,uint len)

{
  char cVar1;
  bool bVar2;
  char *local_30;
  tmbstr cp;
  tmbstr s;
  char *pcStack_18;
  uint len_local;
  ctmbstr str_local;
  TidyAllocator *allocator_local;
  
  cp = (tmbstr)0x0;
  if ((str != (ctmbstr)0x0) && (len != 0)) {
    cp = (tmbstr)(*allocator->vtbl->alloc)(allocator,(long)len + 1);
    local_30 = cp;
    s._4_4_ = len;
    pcStack_18 = str;
    do {
      bVar2 = false;
      if (s._4_4_ != 0) {
        cVar1 = *pcStack_18;
        *local_30 = cVar1;
        bVar2 = cVar1 != '\0';
        local_30 = local_30 + 1;
        pcStack_18 = pcStack_18 + 1;
      }
      s._4_4_ = s._4_4_ - 1;
    } while (bVar2);
    *local_30 = '\0';
  }
  return cp;
}

Assistant:

tmbstr TY_(tmbstrndup)( TidyAllocator *allocator, ctmbstr str, uint len )
{
    tmbstr s = NULL;
    if ( str && len > 0 )
    {
        tmbstr cp = s = (tmbstr) TidyAlloc( allocator, 1+len );
        while ( len-- > 0 &&  (*cp++ = *str++) )
          /**/;
        *cp = 0;
    }
    return s;
}